

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::toHex(QByteArray *this,char separator)

{
  bool bVar1;
  char cVar2;
  qsizetype qVar3;
  QByteArray *this_00;
  char *pcVar4;
  char in_DL;
  QByteArray *in_RSI;
  long lVar5;
  long lVar6;
  QByteArray *in_RDI;
  qsizetype o;
  qsizetype i;
  uchar *data;
  char *hexData;
  qsizetype length;
  QByteArray *hex;
  QByteArray *in_stack_ffffffffffffff80;
  long local_78;
  QByteArray *pQVar7;
  QByteArray *in_stack_ffffffffffffffa8;
  long lVar8;
  long local_50;
  
  pQVar7 = in_RDI;
  bVar1 = isEmpty((QByteArray *)0x4ba39a);
  if (bVar1) {
    QByteArray((QByteArray *)0x4ba3aa);
  }
  else {
    if (in_DL == '\0') {
      qVar3 = size(in_RSI);
      local_78 = qVar3 << 1;
    }
    else {
      qVar3 = size(in_RSI);
      local_78 = qVar3 * 3 + -1;
    }
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray(in_stack_ffffffffffffffa8,(qsizetype)in_RSI,(Initialization)((ulong)pQVar7 >> 0x20));
    this_00 = (QByteArray *)QByteArray::data(in_stack_ffffffffffffff80);
    pcVar4 = QByteArray::data(this_00);
    lVar8 = 0;
    for (local_50 = 0; qVar3 = size(in_RSI), local_50 < qVar3; local_50 = local_50 + 1) {
      cVar2 = QtMiscUtils::toHexLower((int)(uint)(byte)pcVar4[local_50] >> 4);
      lVar5 = lVar8 + 1;
      *(char *)((long)&(this_00->d).d + lVar8) = cVar2;
      cVar2 = QtMiscUtils::toHexLower((byte)pcVar4[local_50] & 0xf);
      lVar6 = lVar5 + 1;
      *(char *)((long)&(this_00->d).d + lVar5) = cVar2;
      lVar8 = lVar6;
      if ((in_DL != '\0') && (lVar6 < local_78)) {
        lVar8 = lVar5 + 2;
        *(char *)((long)&(this_00->d).d + lVar6) = in_DL;
      }
    }
  }
  return pQVar7;
}

Assistant:

QByteArray QByteArray::toHex(char separator) const
{
    if (isEmpty())
        return QByteArray();

    const qsizetype length = separator ? (size() * 3 - 1) : (size() * 2);
    QByteArray hex(length, Qt::Uninitialized);
    char *hexData = hex.data();
    const uchar *data = (const uchar *)this->data();
    for (qsizetype i = 0, o = 0; i < size(); ++i) {
        hexData[o++] = QtMiscUtils::toHexLower(data[i] >> 4);
        hexData[o++] = QtMiscUtils::toHexLower(data[i] & 0xf);

        if ((separator) && (o < length))
            hexData[o++] = separator;
    }
    return hex;
}